

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cfftmf_(int *lot,int *jump,int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,
           int *lensav,double *work,int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R9;
  double dVar3;
  double dVar4;
  long in_stack_00000008;
  fft_complex_t *in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int iw1;
  double *in_stack_00000070;
  double *in_stack_00000078;
  
  *in_stack_00000028 = 0;
  if (*in_R9 < (*in_RDI + -1) * *in_RSI + *in_RCX * (*in_RDX + -1) + 1) {
    *in_stack_00000028 = 1;
  }
  else {
    iVar2 = *(int *)&in_stack_00000010->r;
    iVar1 = *in_RDX;
    dVar3 = log((double)*in_RDX);
    dVar4 = log(2.0);
    if (iVar2 < iVar1 * 2 + (int)(dVar3 / dVar4) + 4) {
      *in_stack_00000028 = 2;
    }
    else if (*in_stack_00000020 < *in_RDI * 2 * *in_RDX) {
      *in_stack_00000028 = 3;
    }
    else {
      iVar2 = xercon_(in_RCX,in_RSI,in_RDX,in_RDI);
      if (iVar2 == 0) {
        *in_stack_00000028 = 4;
      }
    }
  }
  if (*in_RDX != 1) {
    cmfm1f_(in_stack_00000030,in_stack_00000028,in_stack_00000020,(int *)(in_stack_00000018 + -8),
            in_stack_00000010,(double *)(in_stack_00000008 + -8),in_stack_00000070,in_stack_00000078
            ,wsave);
  }
  return 0;
}

Assistant:

int cfftmf_(int *lot, int *jump, int *n, int
	*inc, complex *c__, int *lenc, fft_real_t *wsave, int *lensav, fft_real_t
	*work, int *lenwrk, int *ier)
{
    /* Builtin functions */


    /* Local variables */
     int iw1;
    extern /* Subroutine */ int cmfm1f_(int *, int *, int *,
	    int *, complex *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *);
    extern logical xercon_(int *, int *, int *, int *);
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < (*lot - 1) * *jump + *inc * (*n - 1) + 1) {
	*ier = 1;
	//xerfft_("CFFTMF ", &c__6, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	//xerfft_("CFFTMF ", &c__8, (ftnlen)7);
    } else if (*lenwrk < (*lot << 1) * *n) {
	*ier = 3;
	//xerfft_("CFFTMF ", &c__10, (ftnlen)7);
    } else if (! xercon_(inc, jump, n, lot)) {
	*ier = 4;
	//xerfft_("CFFTMF ", &c_n1, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    cmfm1f_(lot, jump, n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &
	    wsave[iw1 + 1]);
    return 0;
}